

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Am_Value rest_of_height_above_procedure(Am_Object *self)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Am_Value *pAVar5;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar6;
  Am_Object object;
  Am_Object local_30;
  Am_Object local_28;
  long *plVar4;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  iVar2 = (*Am_Object::cc->_vptr_Am_Constraint_Context[6])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)in_RSI,10);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_30,(ulong)*(ushort *)((long)plVar4 + 0xc));
  Am_Object::~Am_Object(&local_30);
  pAVar5 = Am_Object::Get(&local_28,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(in_RSI,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Value::operator=((Am_Value *)self,iVar2 - (iVar3 + (int)plVar4[2]));
  plVar1 = plVar4 + 1;
  *(int *)plVar1 = (int)*plVar1 + -1;
  if ((int)*plVar1 == 0) {
    (**(code **)(*plVar4 + 0x20))(plVar4);
  }
  Am_Object::~Am_Object(&local_28);
  AVar6.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar6._0_8_ = self;
  return AVar6;
}

Assistant:

static Am_Value
rest_of_height_above_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  Am_Object object = self.Get_Owner().Get_Object(store->part);
  value = (int)object.Get(Am_TOP) - (int)self.Get(Am_TOP) - store->offset;
  store->Release();
  return value;
}